

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

uint stb_vorbis_stream_length_in_samples(stb_vorbis *f)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  int64_t iVar4;
  uint uVar5;
  uint uVar6;
  uint last;
  uint end;
  char header [6];
  uint32 local_40;
  uint local_3c;
  uint8 local_36 [6];
  
  uVar6 = f->total_samples;
  if (uVar6 != 0) goto LAB_0011e2ad;
  if (f->stream == (uint8 *)0x0) {
    iVar4 = (*f->f->seek)(f->f->data,0,1);
    uVar6 = (int)iVar4 - f->f_start;
  }
  else {
    uVar6 = (int)f->stream - *(int *)&f->stream_start;
  }
  if (f->stream_len < 0x10000) {
    uVar5 = f->first_audio_page_offset;
  }
  else {
    uVar5 = f->stream_len - 0x10000;
    if (uVar5 <= f->first_audio_page_offset) {
      uVar5 = f->first_audio_page_offset;
    }
  }
  set_file_offset(f,uVar5);
  uVar1 = vorbis_find_page(f,&local_3c,&local_40);
  if (uVar1 == 0) {
LAB_0011e25a:
    f->error = VORBIS_cant_find_last_page;
    f->total_samples = 0xffffffff;
  }
  else {
    if (f->stream == (uint8 *)0x0) {
      iVar4 = (*f->f->seek)(f->f->data,0,1);
      uVar5 = (int)iVar4 - f->f_start;
    }
    else {
      uVar5 = (int)f->stream - *(int *)&f->stream_start;
    }
    if (local_40 == 0) {
      set_file_offset(f,local_3c);
      uVar1 = vorbis_find_page(f,&local_3c,&local_40);
      if (uVar1 != 0) {
        do {
          if (f->stream == (uint8 *)0x0) {
            iVar4 = (*f->f->seek)(f->f->data,0,1);
            uVar5 = (int)iVar4 - f->f_start;
          }
          else {
            uVar5 = (int)f->stream - *(int *)&f->stream_start;
          }
          if (local_40 != 0) break;
          set_file_offset(f,local_3c);
          uVar1 = vorbis_find_page(f,&local_3c,&local_40);
        } while (uVar1 != 0);
      }
    }
    set_file_offset(f,uVar5);
    getn(f,local_36,6);
    uVar1 = get32(f);
    uVar2 = get32(f);
    if ((uVar1 & uVar2) == 0xffffffff) goto LAB_0011e25a;
    uVar3 = 0xfffffffe;
    if (uVar2 == 0) {
      uVar3 = uVar1;
    }
    f->total_samples = uVar3;
    (f->p_last).page_start = uVar5;
    (f->p_last).page_end = local_3c;
    (f->p_last).last_decoded_sample = uVar3;
  }
  set_file_offset(f,uVar6);
  uVar6 = f->total_samples;
LAB_0011e2ad:
  uVar5 = 0;
  if (uVar6 != 0xffffffff) {
    uVar5 = uVar6;
  }
  return uVar5;
}

Assistant:

unsigned int stb_vorbis_stream_length_in_samples(stb_vorbis *f)
{
   unsigned int restore_offset, previous_safe;
   unsigned int end, last_page_loc;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);
   if (!f->total_samples) {
      unsigned int last;
      uint32 lo,hi;
      char header[6];

      // first, store the current decode position so we can restore it
      restore_offset = stb_vorbis_get_file_offset(f);

      // now we want to seek back 64K from the end (the last page must
      // be at most a little less than 64K, but let's allow a little slop)
      if (f->stream_len >= 65536 && f->stream_len-65536 >= f->first_audio_page_offset)
         previous_safe = f->stream_len - 65536;
      else
         previous_safe = f->first_audio_page_offset;

      set_file_offset(f, previous_safe);
      // previous_safe is now our candidate 'earliest known place that seeking
      // to will lead to the final page'

      if (!vorbis_find_page(f, &end, &last)) {
         // if we can't find a page, we're hosed!
         f->error = VORBIS_cant_find_last_page;
         f->total_samples = 0xffffffff;
         goto done;
      }

      // check if there are more pages
      last_page_loc = stb_vorbis_get_file_offset(f);

      // stop when the last_page flag is set, not when we reach eof;
      // this allows us to stop short of a 'file_section' end without
      // explicitly checking the length of the section
      while (!last) {
         set_file_offset(f, end);
         if (!vorbis_find_page(f, &end, &last)) {
            // the last page we found didn't have the 'last page' flag
            // set. whoops!
            break;
         }
         previous_safe = last_page_loc+1;
         last_page_loc = stb_vorbis_get_file_offset(f);
      }

      set_file_offset(f, last_page_loc);

      // parse the header
      getn(f, (unsigned char *)header, 6);
      // extract the absolute granule position
      lo = get32(f);
      hi = get32(f);
      if (lo == 0xffffffff && hi == 0xffffffff) {
         f->error = VORBIS_cant_find_last_page;
         f->total_samples = SAMPLE_unknown;
         goto done;
      }
      if (hi)
         lo = 0xfffffffe; // saturate
      f->total_samples = lo;

      f->p_last.page_start = last_page_loc;
      f->p_last.page_end   = end;
      f->p_last.last_decoded_sample = lo;

     done:
      set_file_offset(f, restore_offset);
   }
   return f->total_samples == SAMPLE_unknown ? 0 : f->total_samples;
}